

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O0

void nk_glfw3_font_stash_begin(nk_font_atlas **atlas)

{
  nk_font_atlas **atlas_local;
  
  nk_font_atlas_init_default(&glfw.atlas);
  nk_font_atlas_begin(&glfw.atlas);
  *atlas = &glfw.atlas;
  return;
}

Assistant:

NK_API void
nk_glfw3_font_stash_begin(struct nk_font_atlas **atlas)
{
    nk_font_atlas_init_default(&glfw.atlas);
    nk_font_atlas_begin(&glfw.atlas);
    *atlas = &glfw.atlas;
}